

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio.c
# Opt level: O0

int archive_write_set_format_cpio(archive *_a)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  int magic_test;
  cpio_conflict *cpio;
  archive_write *a;
  archive *_a_local;
  
  iVar2 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_set_format_cpio");
  if (iVar2 == -0x1e) {
    _a_local._4_4_ = -0x1e;
  }
  else {
    lVar1._0_4_ = _a[2].magic;
    lVar1._4_4_ = _a[2].state;
    if (lVar1 != 0) {
      (**(code **)(_a + 2))(_a);
    }
    pvVar3 = calloc(1,0x40);
    if (pvVar3 == (void *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate cpio data");
      _a_local._4_4_ = -0x1e;
    }
    else {
      *(void **)&_a[1].current_codepage = pvVar3;
      _a[1].sconv = (archive_string_conv *)0x25a76d;
      _a[1].read_data_offset = (int64_t)archive_write_cpio_options;
      _a[1].read_data_remaining = (size_t)archive_write_cpio_header;
      *(code **)&_a[1].read_data_is_posix_read = archive_write_cpio_data;
      _a[1].read_data_output_offset = (int64_t)archive_write_cpio_finish_entry;
      _a[1].read_data_requested = (size_t)archive_write_cpio_close;
      *(code **)(_a + 2) = archive_write_cpio_free;
      _a->archive_format = 0x10001;
      _a->archive_format_name = "POSIX cpio";
      _a_local._4_4_ = 0;
    }
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_write_set_format_cpio(struct archive *_a)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct cpio *cpio;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_set_format_cpio");

	/* If someone else was already registered, unregister them. */
	if (a->format_free != NULL)
		(a->format_free)(a);

	cpio = (struct cpio *)calloc(1, sizeof(*cpio));
	if (cpio == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Can't allocate cpio data");
		return (ARCHIVE_FATAL);
	}
	a->format_data = cpio;
	a->format_name = "cpio";
	a->format_options = archive_write_cpio_options;
	a->format_write_header = archive_write_cpio_header;
	a->format_write_data = archive_write_cpio_data;
	a->format_finish_entry = archive_write_cpio_finish_entry;
	a->format_close = archive_write_cpio_close;
	a->format_free = archive_write_cpio_free;
	a->archive.archive_format = ARCHIVE_FORMAT_CPIO_POSIX;
	a->archive.archive_format_name = "POSIX cpio";
	return (ARCHIVE_OK);
}